

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

void __thiscall S1Interval::AddPoint(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double p_00;
  S2LogMessage local_18;
  
  if (3.141592653589793 < ABS(p)) {
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xa5,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
    abort();
  }
  p_00 = (double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                 -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18);
  bVar3 = FastContains(this,p_00);
  if (bVar3) {
    return;
  }
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if ((((dVar1 != 3.141592653589793) || (NAN(dVar1))) || (dVar2 != -3.141592653589793)) ||
     (NAN(dVar2))) {
    uVar4 = -(ulong)(dVar1 - p_00 < 0.0);
    uVar5 = -(ulong)(p_00 - dVar2 < 0.0);
    if ((double)(~uVar5 & (ulong)(p_00 - dVar2) |
                (ulong)((p_00 + 3.141592653589793) - (dVar2 + -3.141592653589793)) & uVar5) <=
        (double)(~uVar4 & (ulong)(dVar1 - p_00) |
                (ulong)((dVar1 + 3.141592653589793) - (p_00 + -3.141592653589793)) & uVar4)) {
      set_hi(this,p_00);
      return;
    }
  }
  else {
    set_hi(this,p_00);
  }
  set_lo(this,p_00);
  return;
}

Assistant:

void S1Interval::AddPoint(double p) {
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;

  if (FastContains(p)) return;
  if (is_empty()) {
    set_hi(p);
    set_lo(p);
  } else {
    // Compute distance from p to each endpoint.
    double dlo = PositiveDistance(p, lo());
    double dhi = PositiveDistance(hi(), p);
    if (dlo < dhi) {
      set_lo(p);
    } else {
      set_hi(p);
    }
    // Adding a point can never turn a non-full interval into a full one.
  }
}